

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureMemoryRegistry.cpp
# Opt level: O0

SecureMemoryRegistry * SecureMemoryRegistry::i(void)

{
  pointer pSVar1;
  SecureMemoryRegistry *in_stack_00000010;
  unique_ptr<SecureMemoryRegistry,_std::default_delete<SecureMemoryRegistry>_>
  *in_stack_fffffffffffffff0;
  
  pSVar1 = std::unique_ptr<SecureMemoryRegistry,_std::default_delete<SecureMemoryRegistry>_>::get
                     (in_stack_fffffffffffffff0);
  if (pSVar1 == (pointer)0x0) {
    pSVar1 = (pointer)operator_new(0x40);
    SecureMemoryRegistry(in_stack_00000010);
    std::unique_ptr<SecureMemoryRegistry,_std::default_delete<SecureMemoryRegistry>_>::reset
              (in_stack_fffffffffffffff0,pSVar1);
    pSVar1 = std::unique_ptr<SecureMemoryRegistry,_std::default_delete<SecureMemoryRegistry>_>::get
                       (in_stack_fffffffffffffff0);
    if (pSVar1 == (pointer)0x0) {
      softHSMLog(3,"i",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureMemoryRegistry.cpp"
                 ,0x42,"failed to instantiate SecureMemoryRegistry");
    }
  }
  pSVar1 = std::unique_ptr<SecureMemoryRegistry,_std::default_delete<SecureMemoryRegistry>_>::get
                     (in_stack_fffffffffffffff0);
  return pSVar1;
}

Assistant:

SecureMemoryRegistry* SecureMemoryRegistry::i()
{
	if (instance.get() == NULL)
	{
		instance.reset(new SecureMemoryRegistry());

		if (instance.get() == NULL)
		{
			// This is very bad!
			ERROR_MSG("failed to instantiate SecureMemoryRegistry");

		}
	}

	return instance.get();
}